

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_SetMonitoringMode
               (UA_Server *server,UA_Session *session,UA_SetMonitoringModeRequest *request,
               UA_SetMonitoringModeResponse *response)

{
  UA_MonitoringMode UVar1;
  size_t __nmemb;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  UA_MonitoredItem *mon;
  size_t i;
  ulong uVar4;
  UA_Subscription *pUVar5;
  
  pUVar5 = (UA_Subscription *)&session->serverSubscriptions;
  UVar2 = 0x80280000;
  do {
    pUVar5 = (pUVar5->listEntry).le_next;
    if (pUVar5 == (UA_Subscription *)0x0) goto LAB_00125b73;
  } while (pUVar5->subscriptionID != request->subscriptionId);
  if (pUVar5 != (UA_Subscription *)0x0) {
    __nmemb = request->monitoredItemIdsSize;
    if (__nmemb == 0) {
      UVar2 = 0x800f0000;
    }
    else {
      pUVar3 = (UA_StatusCode *)calloc(__nmemb,4);
      response->results = pUVar3;
      if (pUVar3 != (UA_StatusCode *)0x0) {
        response->resultsSize = __nmemb;
        uVar4 = 0;
        do {
          mon = (UA_MonitoredItem *)&pUVar5->monitoredItems;
          do {
            mon = (mon->listEntry).le_next;
            if (mon == (UA_MonitoredItem *)0x0) goto LAB_00125b25;
          } while (mon->itemId != request->monitoredItemIds[uVar4]);
          if (mon == (UA_MonitoredItem *)0x0) {
LAB_00125b25:
            response->results[uVar4] = 0x80420000;
          }
          else {
            UVar1 = request->monitoringMode;
            if (UVar1 != mon->monitoringMode) {
              mon->monitoringMode = UVar1;
              if (UVar1 == UA_MONITORINGMODE_REPORTING) {
                MonitoredItem_registerSampleJob(server,mon);
              }
              else if (mon->sampleJobIsRegistered == true) {
                mon->sampleJobIsRegistered = false;
                UA_Server_removeRepeatedJob(server,mon->sampleJobGuid);
              }
            }
          }
          uVar4 = uVar4 + 1;
          if (response->resultsSize <= uVar4) {
            return;
          }
        } while( true );
      }
      UVar2 = 0x80030000;
    }
  }
LAB_00125b73:
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void Service_SetMonitoringMode(UA_Server *server, UA_Session *session,
                               const UA_SetMonitoringModeRequest *request,
                               UA_SetMonitoringModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing SetMonitoringMode");
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->monitoredItemIdsSize, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < response->resultsSize; ++i) {
        UA_MonitoredItem *mon =
            UA_Subscription_getMonitoredItem(sub, request->monitoredItemIds[i]);
        if(!mon) {
            response->results[i] = UA_STATUSCODE_BADMONITOREDITEMIDINVALID;
            continue;
        }
        if(request->monitoringMode == mon->monitoringMode)
            continue;
        mon->monitoringMode = request->monitoringMode;
        if(mon->monitoringMode == UA_MONITORINGMODE_REPORTING)
            MonitoredItem_registerSampleJob(server, mon);
        else
            MonitoredItem_unregisterSampleJob(server, mon);
    }
}